

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

path * GetOutputFileName_abi_cxx11_(path *__return_storage_ptr__,char **p)

{
  path local_78;
  undefined1 local_40 [8];
  delim_string_t str_name;
  char **p_local;
  
  str_name._32_8_ = p;
  GetDelimitedStringEx_abi_cxx11_((delim_string_t *)local_40,p);
  SJ_FixSlashes((delim_string_t *)local_40,true);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
             ,auto_format);
  std::filesystem::__cxx11::operator/
            (__return_storage_ptr__,(path *)Options::OutPrefix_abi_cxx11_,&local_78);
  std::filesystem::__cxx11::path::~path(&local_78);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EDelimiterType>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EDelimiterType>
           *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::filesystem::path GetOutputFileName(char*& p) {
	auto str_name = GetDelimitedStringEx(p);	// read delimited filename string
	SJ_FixSlashes(str_name);					// convert backslashes *with* warning
	// prefix with output path and force slashes again (without warning)
	return SJ_force_slash(Options::OutPrefix / str_name.first);
}